

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::NetworkUpdateParameters::Clear(NetworkUpdateParameters *this)

{
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
            (&(this->losslayers_).super_RepeatedPtrFieldBase);
  if (this->optimizer_ != (Optimizer *)0x0) {
    (*(this->optimizer_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->optimizer_ = (Optimizer *)0x0;
  if (this->epochs_ != (Int64Parameter *)0x0) {
    (*(this->epochs_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->epochs_ = (Int64Parameter *)0x0;
  if (this->shuffle_ != (BoolParameter *)0x0) {
    (*(this->shuffle_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->shuffle_ = (BoolParameter *)0x0;
  if (this->seed_ != (Int64Parameter *)0x0) {
    (*(this->seed_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->seed_ = (Int64Parameter *)0x0;
  return;
}

Assistant:

void NetworkUpdateParameters::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.NetworkUpdateParameters)
  losslayers_.Clear();
  if (GetArenaNoVirtual() == NULL && optimizer_ != NULL) {
    delete optimizer_;
  }
  optimizer_ = NULL;
  if (GetArenaNoVirtual() == NULL && epochs_ != NULL) {
    delete epochs_;
  }
  epochs_ = NULL;
  if (GetArenaNoVirtual() == NULL && shuffle_ != NULL) {
    delete shuffle_;
  }
  shuffle_ = NULL;
  if (GetArenaNoVirtual() == NULL && seed_ != NULL) {
    delete seed_;
  }
  seed_ = NULL;
}